

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdcmpgif.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  undefined8 extraout_RAX;
  long extraout_RDX;
  gdImagePtr unaff_RBX;
  char *pcVar4;
  undefined4 in_register_0000003c;
  FILE *__filename;
  char *__format;
  undefined8 in_R8;
  undefined8 in_R9;
  gdImagePtr unaff_R14;
  FILE *unaff_R15;
  undefined8 uVar5;
  
  __filename = (FILE *)CONCAT44(in_register_0000003c,argc);
  if (argc == 3) {
    __filename = (FILE *)argv[1];
    pcVar4 = "rb";
    pFVar3 = fopen((char *)__filename,"rb");
    unaff_R14 = (gdImagePtr)argv;
    if (pFVar3 == (FILE *)0x0) goto LAB_0010130c;
    unaff_RBX = (gdImagePtr)gdImageCreateFromGif(pFVar3);
    __filename = pFVar3;
    fclose(pFVar3);
    unaff_R15 = pFVar3;
    if (unaff_RBX == (gdImagePtr)0x0) goto LAB_00101311;
    __filename = (FILE *)argv[2];
    pcVar4 = "rb";
    pFVar3 = fopen((char *)__filename,"rb");
    if (pFVar3 == (FILE *)0x0) goto LAB_00101316;
    unaff_R14 = (gdImagePtr)gdImageCreateFromGif(pFVar3);
    __filename = pFVar3;
    fclose(pFVar3);
    if (unaff_R14 != (gdImagePtr)0x0) {
      CompareImages("gdcmpgif",unaff_RBX,unaff_R14);
      gdImageDestroy(unaff_RBX);
      gdImageDestroy(unaff_R14);
      return 0;
    }
  }
  else {
    main_cold_1();
    pcVar4 = (char *)argv;
LAB_0010130c:
    main_cold_5();
LAB_00101311:
    main_cold_4();
LAB_00101316:
    pFVar3 = unaff_R15;
    main_cold_3();
  }
  main_cold_2();
  uVar5 = extraout_RAX;
  uVar1 = gdImageCompare(pcVar4,extraout_RDX);
  if ((uVar1 & 1) == 0) {
    if (uVar1 == 0) {
      pcVar4 = "%%%s: OK\n";
      goto LAB_001013b8;
    }
    __format = "%%%s: WARNING images differ: WARNING - Probably OK\n";
  }
  else {
    __format = "%%%s: ERROR images differ: BAD\n";
  }
  iVar2 = printf(__format,__filename);
  if ((uVar1 & 0x18) != 0) {
    iVar2 = printf("-%s: INFO image sizes differ\n",__filename);
  }
  if ((uVar1 & 2) != 0) {
    iVar2 = printf("-%s: INFO number of palette entries differ %d Vs. %d\n",__filename,
                   (ulong)*(uint *)((long)pcVar4 + 0x10),(ulong)*(uint *)(extraout_RDX + 0x10),in_R8
                   ,in_R9,uVar5,unaff_RBX,unaff_R14,pFVar3);
  }
  if ((uVar1 & 4) == 0) {
    return iVar2;
  }
  pcVar4 = "-%s: INFO actual colours of pixels differ\n";
LAB_001013b8:
  iVar2 = printf(pcVar4,__filename);
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
	gdImagePtr im1, im2;
	FILE *in;

	if (argc != 3) {
		fprintf(stderr, "Usage: gdcmpgif filename.gif filename.gif\n");
		exit(1);
	}
	in = fopen(argv[1], "rb");
	if (!in) {
		fprintf(stderr, "Input file does not exist!\n");
		exit(1);
	}
	im1 = gdImageCreateFromGif(in);
	fclose(in);

	if (!im1) {
		fprintf(stderr, "Input is not in GIF format!\n");
		exit(1);
	}

	in = fopen(argv[2], "rb");
	if (!in) {
		fprintf(stderr, "Input file 2 does not exist!\n");
		exit(1);
	}
	im2 = gdImageCreateFromGif(in);
	fclose(in);

	if (!im2) {
		fprintf(stderr, "Input 2 is not in GIF format!\n");
		exit(1);
	}

	CompareImages("gdcmpgif", im1, im2);

	gdImageDestroy(im1);
	gdImageDestroy(im2);

	return 0;
}